

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall QDockWidgetGroupWindow::event(QDockWidgetGroupWindow *this,QEvent *e)

{
  ushort uVar1;
  bool bVar2;
  QLayout *pQVar3;
  QWidget *this_00;
  QDockWidget *pQVar4;
  int __fd;
  QEvent *pQVar5;
  
  pQVar5 = e;
  pQVar3 = QWidget::layout((QWidget *)this);
  __fd = (int)pQVar5;
  if (pQVar3 != (QLayout *)0x0) {
    pQVar5 = e;
    bVar2 = QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::windowEvent
                      ((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)(pQVar3 + 1),e);
    __fd = (int)pQVar5;
    if (bVar2) {
      return true;
    }
  }
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 - 0xad < 4) {
    pQVar4 = activeTabbedDockWidget(this);
    if (pQVar4 != (QDockWidget *)0x0) {
      QDockWidgetPrivate::nonClientAreaMouseEvent
                (*(QDockWidgetPrivate **)&(pQVar4->super_QWidget).field_0x8,(QMouseEvent *)e);
    }
  }
  else {
    if (uVar1 != 0xd) {
      if (uVar1 == 0xe) {
        updateCurrentGapRect(this);
        resized(this);
      }
      else if (uVar1 == 0x4c) {
        destroyOrHideIfEmpty(this);
      }
      else if (uVar1 == 0x44) {
        pQVar4 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(*(QObject **)(e + 0x10));
        if (pQVar4 != (QDockWidget *)0x0) {
          adjustFlags(this);
        }
      }
      else if (uVar1 == 0x13) {
        this_00 = &activeTabbedDockWidget(this)->super_QWidget;
        if (this_00 == (QWidget *)0x0) {
          return true;
        }
        QWidget::close(this_00,__fd);
        adjustFlags(this);
        return true;
      }
      bVar2 = QWidget::event((QWidget *)this,e);
      return bVar2;
    }
    pQVar4 = activeTabbedDockWidget(this);
    if (pQVar4 != (QDockWidget *)0x0) {
      QDockWidgetPrivate::moveEvent
                (*(QDockWidgetPrivate **)&(pQVar4->super_QWidget).field_0x8,(QMoveEvent *)e);
    }
  }
  return true;
}

Assistant:

bool QDockWidgetGroupWindow::event(QEvent *e)
{
    auto lay = static_cast<QDockWidgetGroupLayout *>(layout());
    if (lay && lay->windowEvent(e))
        return true;

    switch (e->type()) {
    case QEvent::Close:
#if QT_CONFIG(tabbar)
        // Forward the close to the QDockWidget just as if its close button was pressed
        if (QDockWidget *dw = activeTabbedDockWidget()) {
            dw->close();
            adjustFlags();
        }
#endif
        return true;
    case QEvent::Move:
#if QT_CONFIG(tabbar)
        // Let QDockWidgetPrivate::moseEvent handle the dragging
        if (QDockWidget *dw = activeTabbedDockWidget())
            static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(dw))->moveEvent(static_cast<QMoveEvent*>(e));
#endif
        return true;
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
#if QT_CONFIG(tabbar)
        // Let the QDockWidgetPrivate of the currently visible dock widget handle the drag and drop
        if (QDockWidget *dw = activeTabbedDockWidget())
            static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(dw))->nonClientAreaMouseEvent(static_cast<QMouseEvent*>(e));
#endif
        return true;
    case QEvent::ChildAdded:
        if (qobject_cast<QDockWidget *>(static_cast<QChildEvent*>(e)->child()))
            adjustFlags();
        break;
    case QEvent::LayoutRequest:
        // We might need to show the widget again
        destroyOrHideIfEmpty();
        break;
    case QEvent::Resize:
        updateCurrentGapRect();
        emit resized();
        break;
    default:
        break;
    }
    return QWidget::event(e);
}